

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator++(base_uint<256U> *this)

{
  long lVar1;
  uint32_t uVar2;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int i;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (local_14 < 8) {
      uVar2 = in_RDI->pn[local_14] + 1;
      in_RDI->pn[local_14] = uVar2;
      bVar3 = uVar2 == 0;
    }
    if (!bVar3) break;
    local_14 = local_14 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator++()
    {
        // prefix operator
        int i = 0;
        while (i < WIDTH && ++pn[i] == 0)
            i++;
        return *this;
    }